

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SERecurrentNode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  NodePtr pSVar1;
  NodePtr pSVar2;
  int iVar3;
  undefined4 extraout_var;
  dag_iterator itr;
  TreeDFIterator<spvtools::opt::SENode> local_e0;
  TreeDFIterator<spvtools::opt::SENode> local_88;
  SERecurrentNode *pSVar4;
  
  TreeDFIterator<spvtools::opt::SENode>::TreeDFIterator(&local_e0,node);
  while( true ) {
    TreeDFIterator<spvtools::opt::SENode>::TreeDFIterator(&local_88);
    pSVar2 = local_88.current_;
    pSVar1 = local_e0.current_;
    std::
    _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                    *)&local_88.parent_iterators_);
    if (pSVar1 == pSVar2) break;
    iVar3 = (*(local_e0.current_)->_vptr_SENode[6])();
    pSVar4 = (SERecurrentNode *)CONCAT44(extraout_var,iVar3);
    if ((pSVar4 != (SERecurrentNode *)0x0) && (pSVar4->loop_ == loop)) goto LAB_004fafc8;
    TreeDFIterator<spvtools::opt::SENode>::MoveToNextNode(&local_e0);
  }
  pSVar4 = (SERecurrentNode *)0x0;
LAB_004fafc8:
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_e0.parent_iterators_);
  return pSVar4;
}

Assistant:

SERecurrentNode* ScalarEvolutionAnalysis::GetRecurrentTerm(SENode* node,
                                                           const Loop* loop) {
  for (auto itr = node->graph_begin(); itr != node->graph_end(); ++itr) {
    SERecurrentNode* rec = itr->AsSERecurrentNode();
    if (rec && rec->GetLoop() == loop) {
      return rec;
    }
  }
  return nullptr;
}